

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O2

VectorXd __thiscall CppCNN::flatten_layer(CppCNN *this,LayerValues *input)

{
  DenseStorage<double,__1,__1,__1,_0> *pDVar1;
  long *in_RDX;
  Index extraout_RDX;
  Index IVar2;
  Index extraout_RDX_00;
  long lVar3;
  DenseStorage<double,__1,__1,__1,_0> *other;
  VectorXd VVar4;
  MatrixXd c_value;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  lVar3 = *in_RDX;
  local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
       (PointerType)(((in_RDX[1] - lVar3) / 0x18) * *(long *)(lVar3 + 0x10) * *(long *)(lVar3 + 8));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(unsigned_long *)&local_68);
  pDVar1 = (DenseStorage<double,__1,__1,__1,_0> *)in_RDX[1];
  lVar3 = 0;
  IVar2 = extraout_RDX;
  for (other = (DenseStorage<double,__1,__1,__1,_0> *)*in_RDX; other != pDVar1; other = other + 1) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,__1,_0> *)&c_value,other);
    Eigen::internal::
    inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
              ((Matrix<double,__1,__1,_0,__1,__1> *)&c_value);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&c_value,
               other->m_cols * other->m_rows,1);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,(Matrix<double,__1,_1,_0,__1,_1> *)this,lVar3,
               c_value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols * c_value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               (Matrix<double,__1,__1,_0,__1,__1> *)&c_value);
    lVar3 = lVar3 + c_value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols *
                    c_value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
    free(c_value.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    IVar2 = extraout_RDX_00;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar2;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd CppCNN::flatten_layer(const LayerValues& input) {
	VectorXd v_flatten(input[0].size() * input.size());
	Index start = 0;
	for (auto& c : input) {
		MatrixXd c_value = c;
		c_value.transposeInPlace();
		c_value.resize(c.size(), 1);
		v_flatten.segment(start, c_value.size())= c_value;
		start += c_value.size();
	}
	return v_flatten;
}